

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O1

FileInfo * __thiscall llbuild::buildsystem::BuildValue::getNthOutputInfo(BuildValue *this,uint n)

{
  FileInfo *pFVar1;
  
  if ((this->kind < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20414U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    if (this->numOutputInfos <= n) {
      __assert_fail("n < getNumOutputs()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                    ,0x193,
                    "const FileInfo &llbuild::buildsystem::BuildValue::getNthOutputInfo(unsigned int) const"
                   );
    }
    if (this->numOutputInfos < 2) {
      if (n != 0) {
        __assert_fail("n == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                      ,0x197,
                      "const FileInfo &llbuild::buildsystem::BuildValue::getNthOutputInfo(unsigned int) const"
                     );
      }
      pFVar1 = (FileInfo *)&this->valueData;
    }
    else {
      pFVar1 = (this->valueData).asOutputInfos + n;
    }
    return pFVar1;
  }
  __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0x192,
                "const FileInfo &llbuild::buildsystem::BuildValue::getNthOutputInfo(unsigned int) const"
               );
}

Assistant:

const FileInfo& getNthOutputInfo(unsigned n) const {
    assert(kindHasOutputInfo() && "invalid call for value kind");
    assert(n < getNumOutputs());
    if (hasMultipleOutputs()) {
      return valueData.asOutputInfos[n];
    } else {
      assert(n == 0);
      return valueData.asOutputInfo;
    }
  }